

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O2

Result __thiscall tonk::OutgoingQueue::PushAndGetFreshBuffer(OutgoingQueue *this)

{
  int iVar1;
  Lock *pLVar2;
  undefined8 uVar3;
  uint8_t *puVar4;
  undefined8 *puVar5;
  undefined8 *in_RSI;
  Locker locker;
  Locker local_30;
  
  puVar4 = (uint8_t *)in_RSI[1];
  if (puVar4 != (uint8_t *)0x0) {
    iVar1 = *(int *)(puVar4 + 8);
    if (iVar1 == 0) goto LAB_00123cc4;
    pLVar2 = (Lock *)*in_RSI;
    local_30.TheLock = pLVar2;
    std::recursive_mutex::lock((recursive_mutex *)pLVar2);
    pktalloc::Allocator::Shrink((Allocator *)(pLVar2 + 1),puVar4,iVar1 + 0x3f);
    Locker::~Locker(&local_30);
    uVar3 = in_RSI[1];
    puVar5 = in_RSI + 2;
    if ((undefined8 *)in_RSI[3] != (undefined8 *)0x0) {
      puVar5 = (undefined8 *)in_RSI[3];
    }
    *puVar5 = uVar3;
    in_RSI[3] = uVar3;
  }
  pLVar2 = (Lock *)*in_RSI;
  iVar1 = *(int *)((long)&pLVar2[0xc].cs.super___recursive_mutex_base._M_mutex + 0x14);
  local_30.TheLock = pLVar2;
  std::recursive_mutex::lock((recursive_mutex *)pLVar2);
  puVar4 = pktalloc::Allocator::Allocate((Allocator *)(pLVar2 + 1),iVar1 + 0x18);
  Locker::~Locker(&local_30);
  in_RSI[1] = puVar4;
  if (puVar4 == (uint8_t *)0x0) {
    Result::OutOfMemory();
    return (Result)(ErrorResult *)this;
  }
  puVar4[0] = '\0';
  puVar4[1] = '\0';
  puVar4[2] = '\0';
  puVar4[3] = '\0';
  puVar4[4] = '\0';
  puVar4[5] = '\0';
  puVar4[6] = '\0';
  puVar4[7] = '\0';
  puVar4[8] = '\0';
  puVar4[9] = '\0';
  puVar4[10] = '\0';
  puVar4[0xb] = '\0';
  puVar4[0xc] = '\0';
  puVar4[0xd] = '\0';
  puVar4[0xe] = '\0';
  puVar4[0xf] = '\0';
LAB_00123cc4:
  this->Common = (OutgoingQueueCommon *)0x0;
  return (Result)(ErrorResult *)this;
}

Assistant:

Result OutgoingQueue::PushAndGetFreshBuffer()
{
    if (OutBuffer)
    {
        // If there was no data written yet:
        if (OutBuffer->NextWriteOffset <= 0) {
            return Result::Success();
        }

        const unsigned neededBytes = OutBuffer->NextWriteOffset + kAllocatedOverheadBytes;

        // Reduce memory usage
        Common->WriteAllocator.Shrink(OutBuffer,
            neededBytes);

        // Link at end of list (After NewestQueued)
        if (NewestQueued) {
            NewestQueued->Next = OutBuffer;
        }
        else {
            OldestQueued = OutBuffer;
        }
        NewestQueued = OutBuffer;
        TONK_DEBUG_ASSERT(OutBuffer->Next == nullptr);

        TONK_VERBOSE_OUTGOING_LOG("PushAndGetFreshBuffer : Flushed OutBuffer = ", OutBuffer);
    }

    OutBuffer = (OutgoingQueuedDatagram*)Common->WriteAllocator.Allocate(
        kQueueHeaderBytes + Common->UDPMaxDatagramBytes);

    if (!OutBuffer) {
        return Result::OutOfMemory();
    }

    OutBuffer->Initialize();

    TONK_VERBOSE_OUTGOING_LOG("PushAndGetFreshBuffer : Created new OutBuffer = ", OutBuffer);

    return Result::Success();
}